

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QHeaderView * __thiscall QAccessibleTableCell::horizontalHeader(QAccessibleTableCell *this)

{
  Data *pDVar1;
  QTableView *this_00;
  QHeaderView *pQVar2;
  QTreeView *this_01;
  QObject *pQVar3;
  
  pDVar1 = (this->view).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->view).wp.value;
  }
  this_00 = QtPrivate::qobject_cast_helper<QTableView_const*,QObject>(pQVar3);
  if (this_00 != (QTableView *)0x0) {
    pQVar2 = QTableView::horizontalHeader(this_00);
    return pQVar2;
  }
  pDVar1 = (this->view).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->view).wp.value;
  }
  this_01 = QtPrivate::qobject_cast_helper<QTreeView_const*,QObject>(pQVar3);
  if (this_01 != (QTreeView *)0x0) {
    pQVar2 = QTreeView::header(this_01);
    return pQVar2;
  }
  return (QHeaderView *)0x0;
}

Assistant:

QHeaderView *QAccessibleTableCell::horizontalHeader() const
{
    QHeaderView *header = nullptr;

    if (false) {
#if QT_CONFIG(tableview)
    } else if (const QTableView *tv = qobject_cast<const QTableView*>(view)) {
        header = tv->horizontalHeader();
#endif
#if QT_CONFIG(treeview)
    } else if (const QTreeView *tv = qobject_cast<const QTreeView*>(view)) {
        header = tv->header();
#endif
    }

    return header;
}